

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

uint32_t get_fourcc_by_aom_decoder(aom_codec_iface_t *iface)

{
  uint32_t uVar1;
  aom_codec_iface_t *paVar2;
  
  paVar2 = aom_codec_av1_dx();
  uVar1 = 0x31305641;
  if (paVar2 != iface) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t get_fourcc_by_aom_decoder(aom_codec_iface_t *iface) {
  for (int i = 0; i < get_aom_decoder_count(); ++i) {
    const struct CodecInfo *info = &aom_decoders[i];
    if (info->interface() == iface) {
      return info->fourcc;
    }
  }
  return 0;
}